

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::json_abi_v3_11_3::detail::
binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
::unexpect_eof(binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
               *this,input_format_t format,char *context)

{
  byte bVar1;
  int_type iVar2;
  size_t in_RDX;
  int in_ESI;
  long in_RDI;
  allocator<char> *__a;
  long *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  int iVar3;
  undefined4 in_stack_ffffffffffffff14;
  string *in_stack_ffffffffffffff18;
  input_format_t in_stack_ffffffffffffff24;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_ffffffffffffff28;
  allocator<char> local_c1;
  string local_c0 [32];
  string local_a0 [32];
  undefined1 local_80 [63];
  allocator<char> local_41;
  string local_40 [16];
  undefined8 in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  bool local_1;
  
  iVar3 = *(int *)(in_RDI + 0x10);
  iVar2 = httplib::detail::std::char_traits<char>::eof();
  if (iVar3 == iVar2) {
    __a = *(allocator<char> **)(in_RDI + 0x18);
    __s = *(long **)(in_RDI + 0x28);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
    exception_message(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,in_stack_ffffffffffffff18,
                      (string *)CONCAT44(in_stack_ffffffffffffff14,iVar3));
    parse_error::create<std::nullptr_t,_0>
              (in_ESI,in_RDX,in_stack_ffffffffffffffd8,(void *)in_stack_ffffffffffffffd0);
    bVar1 = (**(code **)(*__s + 0x60))(__s,__a,local_40,local_80);
    local_1 = (bool)(bVar1 & 1);
    parse_error::~parse_error((parse_error *)0x35faa9);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff17);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator(&local_c1);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

JSON_HEDLEY_NON_NULL(3)
    bool unexpect_eof(const input_format_t format, const char* context) const
    {
        if (JSON_HEDLEY_UNLIKELY(current == char_traits<char_type>::eof()))
        {
            return sax->parse_error(chars_read, "<end of file>",
                                    parse_error::create(110, chars_read, exception_message(format, "unexpected end of input", context), nullptr));
        }
        return true;
    }